

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kurtosis.cpp
# Opt level: O3

AggregateFunction * duckdb::KurtosisPopFun::GetFunction(void)

{
  AggregateFunction *in_RDI;
  FunctionNullHandling in_R8B;
  LogicalType LStack_38;
  
  LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffe0,DOUBLE);
  LogicalType::LogicalType(&LStack_38,DOUBLE);
  AggregateFunction::
  UnaryAggregate<duckdb::KurtosisState,double,double,duckdb::KurtosisOperation<duckdb::KurtosisFlagNoBiasCorrection>,(duckdb::AggregateDestructorType)0>
            (in_RDI,(AggregateFunction *)&stack0xffffffffffffffe0,&LStack_38,(LogicalType *)0x0,
             in_R8B);
  LogicalType::~LogicalType(&LStack_38);
  LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffe0);
  (in_RDI->super_BaseScalarFunction).errors = CAN_THROW_RUNTIME_ERROR;
  return in_RDI;
}

Assistant:

AggregateFunction KurtosisPopFun::GetFunction() {
	auto result = AggregateFunction::UnaryAggregate<KurtosisState, double, double,
	                                                KurtosisOperation<KurtosisFlagNoBiasCorrection>>(
	    LogicalType::DOUBLE, LogicalType::DOUBLE);
	result.errors = FunctionErrors::CAN_THROW_RUNTIME_ERROR;
	return result;
}